

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void soul::SanityCheckPass::checkOverallStructure(ModuleBase *module)

{
  int iVar1;
  ProcessorBase *in_RAX;
  ProcessorBase *processorOrGraph;
  undefined4 extraout_var;
  undefined8 *extraout_RDX;
  pool_ptr<soul::AST::ProcessorBase> p;
  pool_ptr<soul::AST::ProcessorBase> local_18;
  undefined8 *puVar2;
  
  local_18.object = in_RAX;
  cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>((soul *)&local_18,module);
  if (local_18.object != (ProcessorBase *)0x0) {
    processorOrGraph = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_18);
    checkOverallStructureOfProcessor(processorOrGraph);
  }
  iVar1 = (*(module->super_Scope)._vptr_Scope[0x11])(&module->super_Scope);
  for (puVar2 = (undefined8 *)CONCAT44(extraout_var,iVar1); puVar2 != extraout_RDX;
      puVar2 = puVar2 + 1) {
    checkOverallStructure((ModuleBase *)*puVar2);
  }
  return;
}

Assistant:

static void checkOverallStructure (AST::ModuleBase& module)
    {
        if (auto p = cast<AST::ProcessorBase> (module))
            checkOverallStructureOfProcessor (*p);

        for (auto m : module.getSubModules())
            checkOverallStructure (m);
    }